

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall PrimitiveTestClass::Deserialize(PrimitiveTestClass *this,CJSON *json)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  longdouble lVar3;
  double dVar4;
  element_type *peVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  char cVar8;
  uchar uVar9;
  short sVar10;
  unsigned_short uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  unsigned_long uVar15;
  longlong lVar16;
  unsigned_long_long uVar17;
  char *pcVar18;
  uchar *puVar19;
  short *psVar20;
  unsigned_short *puVar21;
  int *piVar22;
  uint *puVar23;
  long *plVar24;
  unsigned_long *puVar25;
  longlong *plVar26;
  unsigned_long_long *puVar27;
  float *pfVar28;
  double *pdVar29;
  longdouble *plVar30;
  TestArrObj *pTVar31;
  longdouble *in_RCX;
  longdouble in_ST0;
  float fVar32;
  size_t tmp;
  undefined1 local_50 [32];
  size_t local_30;
  uchar local_28;
  undefined1 uStack_27;
  undefined2 uStack_26;
  undefined4 uStack_24;
  undefined2 uStack_20;
  undefined6 uStack_1e;
  
  pcVar1 = local_50 + 0x10;
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"c","");
  local_28 = '\0';
  cVar8 = CJSON::GetValue<char,_nullptr>(json,(string *)local_50,(char *)&stack0xffffffffffffffd8);
  this->c = cVar8;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"uc","");
  local_28 = '\0';
  uVar9 = CJSON::GetValue<unsigned_char,_nullptr>(json,(string *)local_50,&stack0xffffffffffffffd8);
  this->uc = uVar9;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"s","");
  local_28 = '\0';
  uStack_27 = 0;
  sVar10 = CJSON::GetValue<short,_nullptr>
                     (json,(string *)local_50,(short *)&stack0xffffffffffffffd8);
  this->s = sVar10;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"us","");
  local_28 = '\0';
  uStack_27 = 0;
  uVar11 = CJSON::GetValue<unsigned_short,_nullptr>
                     (json,(string *)local_50,(unsigned_short *)&stack0xffffffffffffffd8);
  this->us = uVar11;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"i","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  iVar12 = CJSON::GetValue<int,_nullptr>(json,(string *)local_50,(int *)&stack0xffffffffffffffd8);
  this->i = iVar12;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ui","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uVar13 = CJSON::GetValue<unsigned_int,_nullptr>
                     (json,(string *)local_50,(uint *)&stack0xffffffffffffffd8);
  this->ui = uVar13;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"l","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  lVar14 = CJSON::GetValue<long,_nullptr>(json,(string *)local_50,(long *)&stack0xffffffffffffffd8);
  this->l = lVar14;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ul","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  uVar15 = CJSON::GetValue<unsigned_long,_nullptr>
                     (json,(string *)local_50,(unsigned_long *)&stack0xffffffffffffffd8);
  this->ul = uVar15;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ll","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  lVar16 = CJSON::GetValue<long_long,_nullptr>
                     (json,(string *)local_50,(longlong *)&stack0xffffffffffffffd8);
  this->ll = lVar16;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ull","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  uVar17 = CJSON::GetValue<unsigned_long_long,_nullptr>
                     (json,(string *)local_50,(unsigned_long_long *)&stack0xffffffffffffffd8);
  this->ull = uVar17;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"f","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  fVar32 = CJSON::GetValue<float,_nullptr>
                     (json,(string *)local_50,(float *)&stack0xffffffffffffffd8);
  this->f = fVar32;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"d","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  dVar4 = CJSON::GetValue<double,_nullptr>
                    (json,(string *)local_50,(double *)&stack0xffffffffffffffd8);
  this->d = dVar4;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ld","");
  lVar3 = (longdouble)0;
  local_28 = SUB101(lVar3,0);
  uStack_27 = (undefined1)((unkuint10)lVar3 >> 8);
  uStack_26 = (undefined2)((unkuint10)lVar3 >> 0x10);
  uStack_24 = (undefined4)((unkuint10)lVar3 >> 0x20);
  uStack_20 = (undefined2)((unkuint10)lVar3 >> 0x40);
  CJSON::GetValue<long_double,_nullptr>
            ((longdouble *)json,(CJSON *)local_50,(string *)&stack0xffffffffffffffd8,in_RCX);
  this->ld = in_ST0;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"str","");
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  pcVar18 = CJSON::GetValue<char_*,_nullptr>
                      (json,(string *)local_50,(char **)&stack0xffffffffffffffd8);
  this->str = pcVar18;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pc","");
  pcVar18 = CJSON::GetValue<char*>(json,(string *)local_50,&local_30);
  this->pc = pcVar18;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"puc","");
  puVar19 = CJSON::GetValue<unsigned_char*>(json,(string *)local_50,&local_30);
  this->puc = puVar19;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ps","");
  psVar20 = CJSON::GetValue<short*>(json,(string *)local_50,&local_30);
  this->ps = psVar20;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pus","");
  puVar21 = CJSON::GetValue<unsigned_short*>(json,(string *)local_50,&local_30);
  this->pus = puVar21;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pi","");
  piVar22 = CJSON::GetValue<int*>(json,(string *)local_50,&local_30);
  this->pi = piVar22;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pui","");
  puVar23 = CJSON::GetValue<unsigned_int*>(json,(string *)local_50,&local_30);
  this->pui = puVar23;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pl","");
  plVar24 = CJSON::GetValue<long*>(json,(string *)local_50,&local_30);
  this->pl = plVar24;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pul","");
  puVar25 = CJSON::GetValue<unsigned_long*>(json,(string *)local_50,&local_30);
  this->pul = puVar25;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pll","");
  plVar26 = CJSON::GetValue<long_long*>(json,(string *)local_50,&local_30);
  this->pll = plVar26;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pull","");
  puVar27 = CJSON::GetValue<unsigned_long_long*>(json,(string *)local_50,&local_30);
  this->pull = puVar27;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pf","");
  pfVar28 = CJSON::GetValue<float*>(json,(string *)local_50,&local_30);
  this->pf = pfVar28;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pd","");
  pdVar29 = CJSON::GetValue<double*>(json,(string *)local_50,&local_30);
  this->pd = pdVar29;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pld","");
  plVar30 = CJSON::GetValue<long_double*>(json,(string *)local_50,&local_30);
  this->pld = plVar30;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"pto","");
  pTVar31 = CJSON::GetValue<TestArrObj*>(json,(string *)local_50,&local_30);
  this->pto = pTVar31;
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"spi","");
  CJSON::GetValue<std::shared_ptr<int>>
            ((CJSON *)&stack0xffffffffffffffd8,(string *)json,(size_t *)local_50);
  peVar5 = (element_type *)CONCAT44(uStack_24,CONCAT22(uStack_26,CONCAT11(uStack_27,local_28)));
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT62(uStack_1e,uStack_20);
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  uStack_20 = _S_red;
  uStack_1e = 0;
  p_Var2 = (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var7;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT62(uStack_1e,uStack_20) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT62(uStack_1e,uStack_20));
    }
  }
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"spto","");
  CJSON::GetValue<std::shared_ptr<TestArrObj>>
            ((CJSON *)&stack0xffffffffffffffd8,(string *)json,(size_t *)local_50);
  peVar6 = (element_type *)CONCAT44(uStack_24,CONCAT22(uStack_26,CONCAT11(uStack_27,local_28)));
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT62(uStack_1e,uStack_20);
  local_28 = '\0';
  uStack_27 = 0;
  uStack_26 = 0;
  uStack_24 = 0;
  uStack_20 = _S_red;
  uStack_1e = 0;
  p_Var2 = (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var7
  ;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT62(uStack_1e,uStack_20) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT62(uStack_1e,uStack_20));
    }
  }
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  return;
}

Assistant:

void Deserialize(CJSON &json)
        {
            c = json.GetValue<char>("c");
            uc = json.GetValue<unsigned char>("uc");
            s = json.GetValue<short>("s");
            us = json.GetValue<unsigned short>("us");
            i = json.GetValue<int>("i");
            ui = json.GetValue<unsigned int>("ui");
            l = json.GetValue<long>("l");
            ul = json.GetValue<unsigned long>("ul");
            ll = json.GetValue<long long>("ll");
            ull = json.GetValue<unsigned long long>("ull");
            f = json.GetValue<float>("f");
            d = json.GetValue<double>("d");
            ld = json.GetValue<long double>("ld");

            str = json.GetValue<char*>("str");

            size_t tmp;

            pc = json.GetValue<char*>("pc", tmp);
            puc = json.GetValue<unsigned char*>("puc", tmp);
            ps = json.GetValue<short*>("ps", tmp);
            pus = json.GetValue<unsigned short*>("pus", tmp);
            pi = json.GetValue<int*>("pi", tmp);
            pui = json.GetValue<unsigned int*>("pui", tmp);
            pl = json.GetValue<long*>("pl", tmp);
            pul = json.GetValue<unsigned long*>("pul", tmp);
            pll = json.GetValue<long long*>("pll", tmp);
            pull = json.GetValue<unsigned long long*>("pull", tmp);
            pf = json.GetValue<float*>("pf", tmp);
            pd = json.GetValue<double*>("pd", tmp);
            pld = json.GetValue<long double*>("pld", tmp);

            pto = json.GetValue<TestArrObj*>("pto", tmp);
            spi = json.GetValue<shared_ptr<int>>("spi", tmp);
            spto = json.GetValue<shared_ptr<TestArrObj>>("spto", tmp);
        }